

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_exclude_pattern_from_file_w
                  (archive *_a,wchar_t *pathname,wchar_t nullSeparator)

{
  int iVar1;
  wchar_t magic_test;
  archive_match *a;
  void *in_stack_00000030;
  wchar_t in_stack_0000003c;
  match_list *in_stack_00000040;
  archive_match *in_stack_00000048;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  undefined4 local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_4 = L'\xffffffe2';
  }
  else {
    local_4 = add_pattern_from_file
                        (in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000030,
                         _a._4_4_);
  }
  return local_4;
}

Assistant:

int
archive_match_exclude_pattern_from_file_w(struct archive *_a,
    const wchar_t *pathname, int nullSeparator)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_exclude_pattern_from_file_w");
	a = (struct archive_match *)_a;

	return add_pattern_from_file(a, &(a->exclusions), 0, pathname,
		nullSeparator);
}